

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  ReflectionSchema *this_00;
  int number;
  string *psVar1;
  OneofDescriptor *oneof_descriptor;
  long lVar2;
  Type TVar3;
  uint32 uVar4;
  string *psVar5;
  long *plVar6;
  Arena *arena;
  ArenaStringPtr *this_01;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  this_00 = &this->schema_;
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar4 = ReflectionSchema::GetExtensionSetOffset(this_00);
    number = *(int *)(field + 0x38);
    TVar3 = FieldDescriptor::type(field);
    psVar5 = ExtensionSet::MutableString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        number,(FieldType)TVar3,field);
  }
  else {
    plVar6 = (long *)ReflectionSchema::GetFieldDefault(this_00,field);
    psVar1 = (string *)*plVar6;
    oneof_descriptor = *(OneofDescriptor **)(field + 0x60);
    if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x38))) {
      ClearOneof(this,message,oneof_descriptor);
      lVar2 = *(long *)(field + 0x60);
      if (lVar2 == 0) {
        SetBit(this,message,field);
      }
      else {
        *(undefined4 *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x40)) >> 4) *
                       -0x55555554 + (this->schema_).oneof_case_offset_)) =
             *(undefined4 *)(field + 0x38);
      }
      uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
      *(string **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = psVar1;
    }
    lVar2 = *(long *)(field + 0x60);
    if (lVar2 == 0) {
      SetBit(this,message,field);
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x40)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x38);
    }
    uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
    this_01 = (ArenaStringPtr *)
              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
    arena = *(Arena **)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).metadata_offset_);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 8);
    }
    psVar5 = this_01->ptr_;
    if (psVar5 == psVar1) {
      ArenaStringPtr::CreateInstance(this_01,arena,value);
      return;
    }
  }
  std::__cxx11::string::_M_assign((string *)psVar5);
  return;
}

Assistant:

void GeneratedMessageReflection::SetString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        const string* default_ptr = &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->UnsafeSetDefault(
              default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)->Set(default_ptr,
            value, GetArena(message));
        break;
      }
    }
  }
}